

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic-capability.c++
# Opt level: O2

Request<capnp::DynamicStruct,_capnp::DynamicStruct> * __thiscall
capnp::DynamicCapability::Client::newRequest
          (Request<capnp::DynamicStruct,_capnp::DynamicStruct> *__return_storage_ptr__,Client *this,
          Method method,Maybe<capnp::MessageSize> *sizeHint)

{
  byte bVar1;
  ClientHook *pCVar2;
  PointerBuilder builder;
  StructSchema schema;
  StructSchema SVar3;
  undefined8 uVar4;
  InterfaceSchema methodInterface;
  Request<capnp::AnyPointer,_capnp::AnyPointer> typeless;
  char local_a8 [8];
  undefined4 local_a0;
  undefined4 uStack_9c;
  uint uStack_98;
  undefined4 uStack_94;
  Builder local_90;
  Fault f;
  undefined8 *local_50;
  uint local_40;
  
  methodInterface = method.parent;
  typeless.super_Builder.builder.segment._0_1_ =
       InterfaceSchema::extends(&this->schema,method.parent);
  if ((bool)typeless.super_Builder.builder.segment._0_1_) {
    schema = InterfaceSchema::Method::getParamType(&method);
    SVar3 = InterfaceSchema::Method::getResultType(&method);
    bVar1 = *(byte *)(*(long *)SVar3.super_Schema.raw + 0x70);
    pCVar2 = (this->super_Client).hook.ptr;
    Schema::getProto((Reader *)&f,&methodInterface.super_Schema);
    if (local_40 < 0x40) {
      uVar4 = 0;
    }
    else {
      uVar4 = *local_50;
    }
    local_a8[0] = (sizeHint->ptr).isSet;
    if ((bool)local_a8[0] == true) {
      local_a0 = *(undefined4 *)&(sizeHint->ptr).field_1;
      uStack_9c = *(undefined4 *)((long)&(sizeHint->ptr).field_1 + 4);
      uStack_98 = (sizeHint->ptr).field_1.value.capCount;
      uStack_94 = *(undefined4 *)((long)&(sizeHint->ptr).field_1 + 0xc);
    }
    (**pCVar2->_vptr_ClientHook)
              (&typeless,pCVar2,uVar4,(ulong)method.ordinal,local_a8,(ulong)(bVar1 ^ 1));
    builder.segment._1_7_ = typeless.super_Builder.builder.segment._1_7_;
    builder.segment._0_1_ = typeless.super_Builder.builder.segment._0_1_;
    builder.capTable = typeless.super_Builder.builder.capTable;
    builder.pointer = typeless.super_Builder.builder.pointer;
    capnp::_::PointerHelpers<capnp::DynamicStruct,_(capnp::Kind)7>::getDynamic
              (&local_90,builder,schema);
    (__return_storage_ptr__->super_Builder).builder.pointers = local_90.builder.pointers;
    (__return_storage_ptr__->super_Builder).builder.dataSize = local_90.builder.dataSize;
    (__return_storage_ptr__->super_Builder).builder.pointerCount = local_90.builder.pointerCount;
    *(undefined2 *)&(__return_storage_ptr__->super_Builder).builder.field_0x26 =
         local_90.builder._38_2_;
    (__return_storage_ptr__->super_Builder).builder.capTable = local_90.builder.capTable;
    (__return_storage_ptr__->super_Builder).builder.data = local_90.builder.data;
    (__return_storage_ptr__->super_Builder).schema.super_Schema.raw =
         (RawBrandedSchema *)local_90.schema.super_Schema.raw;
    (__return_storage_ptr__->super_Builder).builder.segment = local_90.builder.segment;
    (__return_storage_ptr__->hook).disposer = typeless.hook.disposer;
    (__return_storage_ptr__->hook).ptr = typeless.hook.ptr;
    typeless.hook.ptr = (RequestHook *)0x0;
    (__return_storage_ptr__->resultSchema).super_Schema.raw =
         (RawBrandedSchema *)SVar3.super_Schema.raw;
    kj::Own<capnp::RequestHook,_std::nullptr_t>::dispose(&typeless.hook);
    return __return_storage_ptr__;
  }
  kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[42]>
            (&f,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/dynamic-capability.c++"
             ,0x26,FAILED,"schema.extends(methodInterface)",
             "_kjCondition,\"Interface does not implement this method.\"",
             (DebugExpression<bool> *)&typeless,
             (char (*) [42])"Interface does not implement this method.");
  kj::_::Debug::Fault::fatal(&f);
}

Assistant:

Request<DynamicStruct, DynamicStruct> DynamicCapability::Client::newRequest(
    InterfaceSchema::Method method, kj::Maybe<MessageSize> sizeHint) {
  auto methodInterface = method.getContainingInterface();

  KJ_REQUIRE(schema.extends(methodInterface), "Interface does not implement this method.");

  auto paramType = method.getParamType();
  auto resultType = method.getResultType();

  CallHints hints;
  hints.noPromisePipelining = !resultType.mayContainCapabilities();

  auto typeless = hook->newCall(
      methodInterface.getProto().getId(), method.getIndex(), sizeHint, hints);

  return Request<DynamicStruct, DynamicStruct>(
      typeless.getAs<DynamicStruct>(paramType), kj::mv(typeless.hook), resultType);
}